

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

void Extra_Truth3VarN(uint **puCanons,char ***puPhases,char **ppCounters)

{
  char cVar1;
  char *pcVar2;
  int v;
  uint *__s;
  char *__s_00;
  char **__ptr;
  ulong uVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint *puVar9;
  
  __s = (uint *)malloc(0x400);
  lVar5 = 0;
  memset(__s,0,0x400);
  __s_00 = (char *)malloc(0x100);
  memset(__s_00,0,0x100);
  __ptr = (char **)malloc(0x1000);
  *__ptr = (char *)(__ptr + 0x100);
  do {
    *(long *)((long)__ptr + lVar5 + 8) = (long)__ptr + lVar5 + 0x808;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x7f8);
  uVar6 = 0;
  do {
    uVar7 = uVar6 * 0x1010101;
    uVar3 = (ulong)__s[uVar6];
    if (uVar3 == 0) {
      uVar8 = 0;
      do {
        puVar9 = Extra_TruthPolarize::Signs;
        lVar5 = 0;
        uVar3 = uVar6 & 0xffffffff;
        do {
          if ((uVar8 >> ((uint)lVar5 & 0x1f) & 1) != 0) {
            bVar4 = (byte)(1 << ((byte)lVar5 & 0x1f));
            uVar3 = (ulong)((*puVar9 & (uint)uVar3) >> (bVar4 & 0x1f) |
                           (~*puVar9 & (uint)uVar3) << (bVar4 & 0x1f));
          }
          lVar5 = lVar5 + 1;
          puVar9 = puVar9 + 1;
        } while (lVar5 != 3);
        if (((ulong)__s[uVar3] == 0) && (uVar6 != 0 || uVar8 == 0)) {
          __s[uVar3] = (uint)uVar7;
          *__ptr[uVar3] = (char)uVar8;
          __s_00[uVar3] = '\x01';
        }
        else {
          if (uVar7 - __s[uVar3] != 0) {
            __assert_fail("uCanons[uPhase] == uTruth32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMisc.c"
                          ,0x30f,"void Extra_Truth3VarN(unsigned int **, char ***, char **)");
          }
          cVar1 = __s_00[uVar3];
          if ((long)cVar1 < 8) {
            pcVar2 = __ptr[uVar3];
            __s_00[uVar3] = cVar1 + '\x01';
            pcVar2[cVar1] = (char)uVar8;
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != 8);
    }
    else if (uVar7 < uVar3 || uVar7 - uVar3 == 0) {
      __assert_fail("uTruth32 > uCanons[uTruth]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMisc.c"
                    ,0x300,"void Extra_Truth3VarN(unsigned int **, char ***, char **)");
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x100);
  if (puCanons == (uint **)0x0) {
    if (__s != (uint *)0x0) {
      free(__s);
    }
  }
  else {
    *puCanons = __s;
  }
  if (puPhases == (char ***)0x0) {
    free(__ptr);
  }
  else {
    *puPhases = __ptr;
  }
  if (ppCounters == (char **)0x0) {
    if (__s_00 != (char *)0x0) {
      free(__s_00);
      return;
    }
  }
  else {
    *ppCounters = __s_00;
  }
  return;
}

Assistant:

void Extra_Truth3VarN( unsigned ** puCanons, char *** puPhases, char ** ppCounters )
{
    int nPhasesMax = 8;
    unsigned * uCanons;
    unsigned uTruth, uPhase, uTruth32;
    char ** uPhases, * pCounters;
    int nFuncs, nClasses, i;

    nFuncs  = (1 << 8);
    uCanons = ABC_ALLOC( unsigned, nFuncs );
    memset( uCanons, 0, sizeof(unsigned) * nFuncs );
    pCounters = ABC_ALLOC( char, nFuncs );
    memset( pCounters, 0, sizeof(char) * nFuncs );
    uPhases = (char **)Extra_ArrayAlloc( nFuncs, nPhasesMax, sizeof(char) );
    nClasses = 0;
    for ( uTruth = 0; uTruth < (unsigned)nFuncs; uTruth++ )
    {
        // skip already assigned
        uTruth32 = ((uTruth << 24) | (uTruth << 16) | (uTruth << 8) | uTruth);
        if ( uCanons[uTruth] )
        {
            assert( uTruth32 > uCanons[uTruth] );
            continue;
        }
        nClasses++;
        for ( i = 0; i < 8; i++ )
        {
            uPhase = Extra_TruthPolarize( uTruth, i, 3 );
            if ( uCanons[uPhase] == 0 && (uTruth || i==0) )
            {
                uCanons[uPhase]    = uTruth32;
                uPhases[uPhase][0] = i;
                pCounters[uPhase]  = 1;
            }
            else
            {
                assert( uCanons[uPhase] == uTruth32 );
                if ( pCounters[uPhase] < nPhasesMax )
                    uPhases[uPhase][ (int)pCounters[uPhase]++ ] = i;
            }
        }
    }
    if ( puCanons ) 
        *puCanons = uCanons;
    else
        ABC_FREE( uCanons );
    if ( puPhases ) 
        *puPhases = uPhases;
    else
        ABC_FREE( uPhases );
    if ( ppCounters ) 
        *ppCounters = pCounters;
    else
        ABC_FREE( pCounters );
//    printf( "The number of 3N-classes = %d.\n", nClasses );
}